

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall fmt::v6::detail::bigint::multiply(bigint *this,uint32_t value)

{
  uint *puVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar2 != 0) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar3 = 0;
    uVar5 = 0;
    do {
      uVar4 = uVar5 + (ulong)puVar1[sVar3] * (ulong)value;
      puVar1[sVar3] = (uint)uVar4;
      uVar5 = uVar4 >> 0x20;
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
    if (uVar5 != 0) {
      uVar5 = sVar2 + 1;
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar5) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
        sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
        uVar5 = sVar2 + 1;
      }
      puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
      puVar1[sVar2] = (uint)(uVar4 >> 0x20);
    }
  }
  return;
}

Assistant:

size_t size() const FMT_NOEXCEPT { return size_; }